

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O1

void set_sigchld_action(_func_void_int_siginfo_t_ptr_void_ptr *callback)

{
  int iVar1;
  ContextManager *pCVar2;
  sigaction action;
  string local_c8;
  _union_1457 local_a8 [17];
  undefined4 local_20;
  
  memset(local_a8,0,0x98);
  local_20 = 0x10000004;
  local_a8[0] = (_union_1457)callback;
  iVar1 = sigaction(0x11,(sigaction *)local_a8,(sigaction *)0x0);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_c8,"Failed to set SIGCHLD sigaction: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void set_sigchld_action(void (*callback)(int, siginfo_t *, void *)) {
    struct sigaction action{};
    action.sa_sigaction = callback;
    action.sa_flags = (SA_SIGINFO | SA_RESTART);
    if (sigaction(SIGCHLD, &action, nullptr) != 0) {
        die(format("Failed to set SIGCHLD sigaction: %m"));
    }
}